

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_HRR_Writer::WriteHRRFile(OSTEI_HRR_Writer *this,ostream *of,ostream *ofh)

{
  _Rb_tree_color _Var1;
  int iVar2;
  OSTEI_HRR_Algorithm_Base *pOVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  RRStepType RVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  _Type aiVar10;
  string steptypestr_1;
  string steptypestr;
  HRRDoubletStepList brasteps;
  HRRDoubletStepList ketsteps;
  QAM finalam;
  stringstream prototype_ncartket;
  stringstream prototype;
  allocator local_632;
  allocator local_631;
  OSTEI_HRR_Writer *local_630;
  _Type local_628;
  undefined8 uStack_620;
  _Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> local_610;
  string local_5e0;
  string local_5c0;
  int local_59c;
  undefined1 local_598 [8];
  _Alloc_hider local_590;
  size_type local_588;
  char local_580 [16];
  ostream *local_570;
  HRRDoubletStepList local_568;
  HRRDoubletStepList local_550;
  undefined1 local_538 [8];
  _Alloc_hider local_530;
  size_type local_528;
  char local_520 [16];
  string local_510;
  undefined1 local_4f0 [48];
  undefined1 local_4c0 [392];
  char *local_338;
  size_type local_330;
  char local_328 [8];
  undefined8 uStack_320;
  char *local_318;
  size_type local_310;
  char local_308 [8];
  undefined8 uStack_300;
  undefined1 local_2f8 [40];
  undefined1 local_2d0 [40];
  undefined1 local_2a8 [40];
  undefined1 local_280 [40];
  undefined1 local_258 [40];
  undefined1 local_230 [40];
  undefined1 local_208 [40];
  undefined1 local_1e0 [40];
  allocator local_1b8 [16];
  ostream local_1a8 [376];
  
  local_630 = this;
  local_570 = ofh;
  QAM::QAM((QAM *)local_4f0,&(this->info_->super_GeneratorInfoBase).finalam_);
  local_628[1] = local_4f0._4_4_;
  local_628[0] = local_4f0._0_4_;
  uStack_620 = 0;
  std::__cxx11::string::string((string *)&local_318,"",local_1b8);
  local_590._M_p = local_580;
  local_598._0_4_ = local_628[0];
  local_598._4_4_ = local_628[1];
  if (local_318 == local_308) {
    local_580[8] = (undefined1)uStack_300;
    local_580[9] = uStack_300._1_1_;
    local_580[10] = uStack_300._2_1_;
    local_580[0xb] = uStack_300._3_1_;
    local_580[0xc] = uStack_300._4_1_;
    local_580[0xd] = uStack_300._5_1_;
    local_580[0xe] = uStack_300._6_1_;
    local_580[0xf] = uStack_300._7_1_;
  }
  else {
    local_590._M_p = local_318;
  }
  local_588 = local_310;
  local_310 = 0;
  local_308[0] = '\0';
  local_318 = local_308;
  std::__cxx11::string::~string((string *)&local_318);
  local_628[1] = local_4f0._12_4_;
  local_628[0] = local_4f0._8_4_;
  uStack_620 = 0;
  std::__cxx11::string::string((string *)&local_338,"",local_1b8);
  local_530._M_p = local_520;
  local_538._0_4_ = local_628[0];
  local_538._4_4_ = local_628[1];
  if (local_338 == local_328) {
    local_520[8] = (undefined1)uStack_320;
    local_520[9] = uStack_320._1_1_;
    local_520[10] = uStack_320._2_1_;
    local_520[0xb] = uStack_320._3_1_;
    local_520[0xc] = uStack_320._4_1_;
    local_520[0xd] = uStack_320._5_1_;
    local_520[0xe] = uStack_320._6_1_;
    local_520[0xf] = uStack_320._7_1_;
  }
  else {
    local_530._M_p = local_338;
  }
  local_528 = local_330;
  local_330 = 0;
  local_328[0] = '\0';
  local_338 = local_328;
  std::__cxx11::string::~string((string *)&local_338);
  pOVar3 = local_630->hrr_algo_;
  DAM::DAM((DAM *)local_230,(DAM *)local_598);
  OSTEI_HRR_Algorithm_Base::GetBraSteps(&local_568,pOVar3,(DAM *)local_230);
  std::__cxx11::string::~string((string *)(local_230 + 8));
  pOVar3 = local_630->hrr_algo_;
  DAM::DAM((DAM *)local_258,(DAM *)local_538);
  OSTEI_HRR_Algorithm_Base::GetKetSteps(&local_550,pOVar3,(DAM *)local_258);
  std::__cxx11::string::~string((string *)(local_258 + 8));
  if (local_568.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_568.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pOVar3 = local_630->hrr_algo_;
    DAM::DAM((DAM *)local_280,(DAM *)local_598);
    RVar6 = OSTEI_HRR_Algorithm_Base::GetBraRRStep(pOVar3,(DAM *)local_280);
    std::__cxx11::string::~string((string *)(local_280 + 8));
    RRStepTypeToStr_abi_cxx11_(&local_5c0,RVar6);
    std::operator<<(of,"//////////////////////////////////////////////\n");
    poVar7 = std::operator<<(of,"// BRA: ( ");
    poVar7 = std::operator<<(poVar7,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                    [(int)local_598._0_4_]);
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = std::operator<<(poVar7,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                    [(int)local_598._4_4_]);
    std::operator<<(poVar7," |\n");
    poVar7 = std::operator<<(of,"// Steps: ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,"\n");
    std::operator<<(of,"//////////////////////////////////////////////\n");
    std::operator<<(of,"\n");
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar7 = std::operator<<(local_1a8,"void HRR_");
    poVar7 = std::operator<<(poVar7,(string *)&local_5c0);
    std::operator<<(poVar7,"_");
    poVar7 = std::operator<<(local_1a8,
                             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                             [(int)local_598._0_4_]);
    poVar7 = std::operator<<(poVar7,"_");
    poVar7 = std::operator<<(poVar7,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                    [(int)local_598._4_4_]);
    std::operator<<(poVar7,"(");
    poVar7 = std::operator<<(local_1a8,"double * const restrict ");
    uVar5 = local_4f0._4_4_;
    uVar4 = local_4f0._0_4_;
    std::__cxx11::string::string((string *)&local_610,"X_X",(allocator *)&local_5e0);
    HRRVarName((string *)local_4c0,uVar4,uVar5,(string *)&local_610);
    poVar7 = std::operator<<(poVar7,(string *)local_4c0);
    std::operator<<(poVar7,",\n");
    std::__cxx11::string::~string((string *)local_4c0);
    std::__cxx11::string::~string((string *)&local_610);
    pOVar3 = local_630->hrr_algo_;
    DAM::DAM((DAM *)local_2a8,(DAM *)local_598);
    OSTEI_HRR_Algorithm_Base::GetBraAMReq((DAMSet *)local_4c0,pOVar3,(DAM *)local_2a8);
    std::__cxx11::string::~string((string *)(local_2a8 + 8));
    for (p_Var8 = (_Rb_tree_node_base *)local_4c0._24_8_;
        p_Var8 != (_Rb_tree_node_base *)(local_4c0 + 8);
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      poVar7 = std::operator<<(local_1a8,(string *)&indent5_abi_cxx11_);
      poVar7 = std::operator<<(poVar7,"double const * const restrict ");
      _Var1 = p_Var8[1]._M_color;
      iVar2 = *(int *)&p_Var8[1].field_0x4;
      std::__cxx11::string::string((string *)&local_5e0,"X_X",(allocator *)&local_510);
      HRRVarName((string *)&local_610,_Var1,iVar2,&local_5e0);
      poVar7 = std::operator<<(poVar7,(string *)&local_610);
      std::operator<<(poVar7,",\n");
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_5e0);
    }
    std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
              ((_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *)
               local_4c0);
    poVar7 = std::operator<<(local_1a8,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar7,"const double hAB[3], const int ncart_ket)");
    local_628[0] = 0;
    local_628[1] = 0;
    for (; local_628 != (_Type)0xf; local_628 = (_Type)((long)local_628 + 1)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_4c0);
      poVar7 = std::operator<<((ostream *)(local_4c0 + 0x10),"static void HRR_");
      poVar7 = std::operator<<(poVar7,(string *)&local_5c0);
      std::operator<<(poVar7,"_");
      poVar7 = std::operator<<((ostream *)(local_4c0 + 0x10),
                               "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                               [(int)local_598._0_4_]);
      poVar7 = std::operator<<(poVar7,"_");
      poVar7 = std::operator<<(poVar7,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                      [(int)local_598._4_4_]);
      poVar7 = std::operator<<(poVar7,"_");
      local_59c = *(int *)(&DAT_0013a3b0 + (long)local_628 * 4);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,local_59c);
      std::operator<<(poVar7,"(");
      poVar7 = std::operator<<((ostream *)(local_4c0 + 0x10),"double * const restrict ");
      uVar5 = local_4f0._4_4_;
      uVar4 = local_4f0._0_4_;
      std::__cxx11::string::string((string *)&local_5e0,"X_X",(allocator *)&local_510);
      HRRVarName((string *)&local_610,uVar4,uVar5,&local_5e0);
      poVar7 = std::operator<<(poVar7,(string *)&local_610);
      std::operator<<(poVar7,",\n");
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_5e0);
      pOVar3 = local_630->hrr_algo_;
      DAM::DAM((DAM *)local_1e0,(DAM *)local_598);
      OSTEI_HRR_Algorithm_Base::GetBraAMReq((DAMSet *)&local_610,pOVar3,(DAM *)local_1e0);
      std::__cxx11::string::~string((string *)(local_1e0 + 8));
      for (p_Var9 = local_610._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &local_610._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        poVar7 = std::operator<<((ostream *)(local_4c0 + 0x10),(string *)&indent5_abi_cxx11_);
        poVar7 = std::operator<<(poVar7,"double const * const restrict ");
        _Var1 = p_Var9[1]._M_color;
        iVar2 = *(int *)&p_Var9[1].field_0x4;
        std::__cxx11::string::string((string *)&local_510,"X_X",&local_632);
        HRRVarName(&local_5e0,_Var1,iVar2,&local_510);
        poVar7 = std::operator<<(poVar7,(string *)&local_5e0);
        std::operator<<(poVar7,",\n");
        std::__cxx11::string::~string((string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_510);
      }
      std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
                (&local_610);
      poVar7 = std::operator<<((ostream *)(local_4c0 + 0x10),(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar7,"const double hAB[3])");
      std::__cxx11::stringbuf::str();
      poVar7 = std::operator<<(of,(string *)&local_610);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&local_610);
      std::operator<<(of,"{\n");
      poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
      std::operator<<(poVar7,"int iket;\n");
      std::operator<<(of,"\n");
      std::__cxx11::string::string((string *)&local_610,"",&local_632);
      std::__cxx11::to_string(&local_5e0,local_59c);
      std::__cxx11::string::string((string *)&local_510,"X_X",&local_631);
      WriteBraSteps_(local_630,of,&local_568,(string *)&local_610,&local_5e0,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_610);
      std::operator<<(of,"\n");
      std::operator<<(of,"}\n");
      std::operator<<(of,"\n");
      std::operator<<(of,"\n");
      std::__cxx11::stringstream::~stringstream((stringstream *)local_4c0);
    }
    std::__cxx11::stringbuf::str();
    poVar7 = std::operator<<(of,(string *)local_4c0);
    std::operator<<(poVar7,"\n{\n");
    std::__cxx11::string::~string((string *)local_4c0);
    poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"int done_brastep = 0;\n");
    aiVar10[0] = 0;
    aiVar10[1] = 0;
    while (aiVar10 != (_Type)0xf) {
      local_628 = aiVar10;
      poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
      poVar7 = std::operator<<(poVar7,"if (ncart_ket == ");
      iVar2 = *(int *)(&DAT_0013a3b0 + (long)local_628 * 4);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar2);
      std::operator<<(poVar7,")\n");
      poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
      std::operator<<(poVar7,"{\n");
      poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
      poVar7 = std::operator<<(poVar7,(string *)&indent1_abi_cxx11_);
      poVar7 = std::operator<<(poVar7,"HRR_");
      poVar7 = std::operator<<(poVar7,(string *)&local_5c0);
      poVar7 = std::operator<<(poVar7,"_");
      poVar7 = std::operator<<(poVar7,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                      [(int)local_598._0_4_]);
      std::operator<<(poVar7,"_");
      poVar7 = std::operator<<(of,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(int)local_598._4_4_]);
      poVar7 = std::operator<<(poVar7,"_");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar2);
      std::operator<<(poVar7,"(");
      uVar5 = local_4f0._4_4_;
      uVar4 = local_4f0._0_4_;
      std::__cxx11::string::string((string *)&local_610,"X_X",(allocator *)&local_5e0);
      HRRVarName((string *)local_4c0,uVar4,uVar5,(string *)&local_610);
      poVar7 = std::operator<<(of,(string *)local_4c0);
      std::operator<<(poVar7,", ");
      std::__cxx11::string::~string((string *)local_4c0);
      std::__cxx11::string::~string((string *)&local_610);
      pOVar3 = local_630->hrr_algo_;
      DAM::DAM((DAM *)local_208,(DAM *)local_598);
      OSTEI_HRR_Algorithm_Base::GetBraAMReq((DAMSet *)local_4c0,pOVar3,(DAM *)local_208);
      std::__cxx11::string::~string((string *)(local_208 + 8));
      for (p_Var8 = (_Rb_tree_node_base *)local_4c0._24_8_;
          p_Var8 != (_Rb_tree_node_base *)(local_4c0 + 8);
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        _Var1 = p_Var8[1]._M_color;
        iVar2 = *(int *)&p_Var8[1].field_0x4;
        std::__cxx11::string::string((string *)&local_5e0,"X_X",(allocator *)&local_510);
        HRRVarName((string *)&local_610,_Var1,iVar2,&local_5e0);
        poVar7 = std::operator<<(of,(string *)&local_610);
        std::operator<<(poVar7,", ");
        std::__cxx11::string::~string((string *)&local_610);
        std::__cxx11::string::~string((string *)&local_5e0);
      }
      std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
                ((_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *)
                 local_4c0);
      std::operator<<(of,"hAB);\n");
      poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
      poVar7 = std::operator<<(poVar7,(string *)&indent1_abi_cxx11_);
      std::operator<<(poVar7,"done_brastep = 1;\n");
      poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
      std::operator<<(poVar7,"}\n\n");
      aiVar10 = (_Type)((long)local_628 + 1);
    }
    poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"if (done_brastep == 0) \n");
    poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"{\n");
    poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"int iket;\n");
    std::operator<<(of,"\n");
    std::__cxx11::string::string((string *)local_4c0,"",(allocator *)&local_510);
    std::__cxx11::string::string((string *)&local_610,"ncart_ket",&local_632);
    std::__cxx11::string::string((string *)&local_5e0,"X_X",&local_631);
    WriteBraSteps_(local_630,of,&local_568,(string *)local_4c0,(string *)&local_610,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)local_4c0);
    poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"}\n");
    std::operator<<(of,"\n");
    std::operator<<(of,"}\n");
    std::operator<<(of,"\n");
    std::operator<<(of,"\n");
    std::__cxx11::stringbuf::str();
    poVar7 = std::operator<<(local_570,(string *)local_4c0);
    std::operator<<(poVar7,";\n\n");
    std::__cxx11::string::~string((string *)local_4c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::__cxx11::string::~string((string *)&local_5c0);
  }
  if (local_550.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_550.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pOVar3 = local_630->hrr_algo_;
    DAM::DAM((DAM *)local_2d0,(DAM *)local_538);
    RVar6 = OSTEI_HRR_Algorithm_Base::GetKetRRStep(pOVar3,(DAM *)local_2d0);
    std::__cxx11::string::~string((string *)(local_2d0 + 8));
    RRStepTypeToStr_abi_cxx11_((string *)&local_610,RVar6);
    std::operator<<(of,"//////////////////////////////////////////////\n");
    poVar7 = std::operator<<(of,"// KET: | ");
    poVar7 = std::operator<<(poVar7,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                    [(int)local_538._0_4_]);
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = std::operator<<(poVar7,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                    [(int)local_538._4_4_]);
    std::operator<<(poVar7," )\n");
    poVar7 = std::operator<<(of,"// Steps: ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,"\n");
    std::operator<<(of,"//////////////////////////////////////////////\n");
    std::operator<<(of,"\n");
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar7 = std::operator<<(local_1a8,"void HRR_");
    poVar7 = std::operator<<(poVar7,(string *)&local_610);
    std::operator<<(poVar7,"_");
    poVar7 = std::operator<<(local_1a8,
                             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                             [(int)local_538._0_4_]);
    poVar7 = std::operator<<(poVar7,"_");
    poVar7 = std::operator<<(poVar7,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                    [(int)local_538._4_4_]);
    std::operator<<(poVar7,"(");
    poVar7 = std::operator<<(local_1a8,"double * const restrict ");
    std::__cxx11::string::string((string *)&local_5c0,"X_X",(allocator *)&local_5e0);
    HRRVarName((string *)local_4c0,&local_5c0,local_4f0._8_4_,local_4f0._12_4_);
    poVar7 = std::operator<<(poVar7,(string *)local_4c0);
    std::operator<<(poVar7,",\n");
    std::__cxx11::string::~string((string *)local_4c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    pOVar3 = local_630->hrr_algo_;
    DAM::DAM((DAM *)local_2f8,(DAM *)local_538);
    OSTEI_HRR_Algorithm_Base::GetKetAMReq((DAMSet *)local_4c0,pOVar3,(DAM *)local_2f8);
    std::__cxx11::string::~string((string *)(local_2f8 + 8));
    for (p_Var8 = (_Rb_tree_node_base *)local_4c0._24_8_;
        p_Var8 != (_Rb_tree_node_base *)(local_4c0 + 8);
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      poVar7 = std::operator<<(local_1a8,(string *)&indent5_abi_cxx11_);
      poVar7 = std::operator<<(poVar7,"double const * const restrict ");
      std::__cxx11::string::string((string *)&local_5e0,"X_X",(allocator *)&local_510);
      HRRVarName(&local_5c0,&local_5e0,p_Var8[1]._M_color,*(int *)&p_Var8[1].field_0x4);
      poVar7 = std::operator<<(poVar7,(string *)&local_5c0);
      std::operator<<(poVar7,",\n");
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_5e0);
    }
    std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
              ((_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *)
               local_4c0);
    poVar7 = std::operator<<(local_1a8,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar7,"const double hCD[3], const int ncart_bra)");
    std::__cxx11::stringbuf::str();
    poVar7 = std::operator<<(of,(string *)local_4c0);
    std::operator<<(poVar7,"\n");
    std::__cxx11::string::~string((string *)local_4c0);
    std::operator<<(of,"{\n");
    poVar7 = std::operator<<(of,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"int ibra;\n");
    std::operator<<(of,"\n");
    std::__cxx11::string::string((string *)local_4c0,"",(allocator *)&local_510);
    std::__cxx11::string::string((string *)&local_5c0,"ncart_bra",&local_632);
    std::__cxx11::string::string((string *)&local_5e0,"X_X",&local_631);
    WriteKetSteps_(local_630,of,&local_550,(string *)local_4c0,&local_5c0,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)local_4c0);
    std::operator<<(of,"\n");
    std::operator<<(of,"}\n");
    std::operator<<(of,"\n");
    std::operator<<(of,"\n");
    std::__cxx11::stringbuf::str();
    poVar7 = std::operator<<(local_570,(string *)local_4c0);
    std::operator<<(poVar7,";\n\n");
    std::__cxx11::string::~string((string *)local_4c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::__cxx11::string::~string((string *)&local_610);
  }
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_550);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_568);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)(local_4f0 + 0x10));
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRRFile(std::ostream & of, std::ostream & ofh) const
{
    QAM finalam = info_.FinalAM();
    DAM braam = {finalam[0], finalam[1]};
    DAM ketam = {finalam[2], finalam[3]};

    // only call the function for the last doublets
    HRRDoubletStepList brasteps = hrr_algo_.GetBraSteps(braam);
    HRRDoubletStepList ketsteps = hrr_algo_.GetKetSteps(ketam);

    if(brasteps.size() > 0)
    {
        RRStepType brasteptype = hrr_algo_.GetBraRRStep(braam);
        std::string steptypestr = RRStepTypeToStr(brasteptype);

        of << "//////////////////////////////////////////////\n";
        of << "// BRA: ( " << amchar[braam[0]] << " " << amchar[braam[1]] << " |\n";
        of << "// Steps: " << brasteps.size() << "\n";
        of << "//////////////////////////////////////////////\n";
        of << "\n";

        std::stringstream prototype;
        

        prototype << "void HRR_" << steptypestr << "_";
        prototype << amchar[braam[0]] << "_" << amchar[braam[1]] << "(";

        // pointer to result buffer
        prototype << "double * const restrict " << HRRVarName(finalam[0], finalam[1], "X_X") << ",\n";

        // pointer to requirements
        for(const auto & it : hrr_algo_.GetBraAMReq(braam))
            prototype << indent5 << "double const * const restrict " << HRRVarName(it[0], it[1], "X_X") << ",\n";

        prototype << indent5 << "const double hAB[3], const int ncart_ket)";

        // Create different functions for different ncart_ket values
        const int ncart_ket_vals[15] = {1, 3, 6, 10, 15, 21, 28, 36, 45, 55, 66, 78, 91, 105, 120};
        for (int ival = 0; ival < 15; ival++)
        {
            std::stringstream prototype_ncartket;
            prototype_ncartket << "static void HRR_" << steptypestr << "_";
            prototype_ncartket << amchar[braam[0]] << "_" << amchar[braam[1]] << "_" << ncart_ket_vals[ival] << "(";

            // pointer to result buffer
            prototype_ncartket << "double * const restrict " << HRRVarName(finalam[0], finalam[1], "X_X") << ",\n";

            // pointer to requirements
            for(const auto & it : hrr_algo_.GetBraAMReq(braam))
                prototype_ncartket << indent5 << "double const * const restrict " << HRRVarName(it[0], it[1], "X_X") << ",\n";

            prototype_ncartket << indent5 << "const double hAB[3])";
            
            of << prototype_ncartket.str() << "\n";
            of << "{\n";
            of << indent1 << "int iket;\n";
            of << "\n";
            
            WriteBraSteps_(of, brasteps, "", std::to_string(ncart_ket_vals[ival]), "X_X"); 
            
            of << "\n";
            of << "}\n";
            of << "\n";
            of << "\n";
        }
        
        
        of << prototype.str() << "\n{\n";  // Original function header
        
        // Wrapper for different ncart_ket value functions
        of << indent1 << "int done_brastep = 0;\n";
        for (int ival = 0; ival < 15; ival++)
        {
            of << indent1 << "if (ncart_ket == " << ncart_ket_vals[ival] << ")\n";
            of << indent1 << "{\n";
            
            // function name
            of << indent1 << indent1 << "HRR_" << steptypestr << "_" << amchar[braam[0]] << "_";
            of << amchar[braam[1]] << "_" << ncart_ket_vals[ival] << "(";
            
            // pointer to result buffer
            of << HRRVarName(finalam[0], finalam[1], "X_X") << ", ";
            
            // pointer to requirements
            for(const auto & it : hrr_algo_.GetBraAMReq(braam))
                of << HRRVarName(it[0], it[1], "X_X") << ", ";
            of << "hAB);\n";
            
            of << indent1 << indent1 << "done_brastep = 1;\n";
            
            of << indent1 << "}\n\n";
        }
        
        
        // General situtaion
        of << indent1 << "if (done_brastep == 0) \n";
        of << indent1 << "{\n";
        
        of << indent1 << indent1 << "int iket;\n";
        of << "\n";
        
        WriteBraSteps_(of, brasteps, "", "ncart_ket", "X_X"); 
        
        of << indent1 << "}\n";

        of << "\n";
        of << "}\n";
        of << "\n";
        of << "\n";


        // header
        ofh << prototype.str() << ";\n\n";

    }

    if(ketsteps.size() > 0)
    {
        RRStepType ketsteptype = hrr_algo_.GetKetRRStep(ketam);
        std::string steptypestr = RRStepTypeToStr(ketsteptype);

        of << "//////////////////////////////////////////////\n";
        of << "// KET: | " << amchar[ketam[0]] << " " << amchar[ketam[1]] << " )\n";
        of << "// Steps: " << ketsteps.size() << "\n";
        of << "//////////////////////////////////////////////\n";
        of << "\n";

        std::stringstream prototype;

        prototype << "void HRR_" << steptypestr << "_";
        prototype << amchar[ketam[0]] << "_" << amchar[ketam[1]] << "(";

        // pointer to result buffer
        prototype << "double * const restrict " << HRRVarName("X_X", finalam[2], finalam[3]) << ",\n";

        // pointer to requirements
        for(const auto & it : hrr_algo_.GetKetAMReq(ketam))
            prototype << indent5 << "double const * const restrict " << HRRVarName("X_X", it[0], it[1]) << ",\n";

        prototype << indent5 << "const double hCD[3], const int ncart_bra)";



        of << prototype.str() << "\n";
        of << "{\n";
        of << indent1 << "int ibra;\n";
        of << "\n";

        WriteKetSteps_(of, ketsteps, "", "ncart_bra", "X_X"); 

        of << "\n";
        of << "}\n";
        of << "\n";
        of << "\n";


        // header
        ofh << prototype.str() << ";\n\n";
    }
}